

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O1

int CfdInitializeBlockHandle(void *handle,int network_type,char *block_hex,void **block_handle)

{
  bool bVar1;
  NetType NVar2;
  void *pvVar3;
  Block *this;
  CfdException *pCVar4;
  bool is_bitcoin;
  bool local_5a;
  allocator local_59;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  void *local_38;
  
  local_38 = handle;
  cfd::Initialize();
  if (block_handle == (void **)0x0) {
    local_58._0_8_ = "cfdcapi_block.cpp";
    local_58._8_4_ = 0x54;
    local_48._M_allocated_capacity = 0x62cc11;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"block_handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Failed to parameter. block_handle is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(block_hex);
  if (!bVar1) {
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"BlockOpe","");
    pvVar3 = cfd::capi::AllocBuffer((string *)local_58,0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
    }
    local_5a = false;
    NVar2 = cfd::capi::ConvertNetType(network_type,&local_5a);
    *(NetType *)((long)pvVar3 + 0x10) = NVar2;
    if (local_5a == true) {
      this = (Block *)operator_new(0xa8);
      std::__cxx11::string::string((string *)local_58,block_hex,&local_59);
      cfd::core::Block::Block(this,(string *)local_58);
      *(Block **)((long)pvVar3 + 0x18) = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
      *block_handle = pvVar3;
      return 0;
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Elements is not supported.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_58._0_8_ = "cfdcapi_block.cpp";
  local_58._8_4_ = 0x5a;
  local_48._M_allocated_capacity = 0x62cc11;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"block_hex is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Failed to parameter. block_hex is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeBlockHandle(
    void* handle, int network_type, const char* block_hex,
    void** block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiBlockData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (block_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "block_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_handle is null.");
    }
    if (IsEmptyString(block_hex)) {
      warn(CFD_LOG_SOURCE, "block_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_hex is null or empty.");
    }

    buffer = static_cast<CfdCapiBlockData*>(
        AllocBuffer(kPrefixBlock, sizeof(CfdCapiBlockData)));

    bool is_bitcoin = false;
    buffer->net_type = ConvertNetType(network_type, &is_bitcoin);
    if (is_bitcoin) {
      buffer->block = new Block(std::string(block_hex));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    *block_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeBlockHandle(handle, buffer);
  return result;
}